

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::to_regexp_object
          (anon_unknown_35 *this,gc_heap_ptr<mjs::global_object> *global,value *regexp)

{
  gc_heap *this_00;
  bool bVar1;
  void *pvVar2;
  uint *puVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  undefined8 extraout_RDX_01;
  gc_heap_ptr<mjs::regexp_object> gVar5;
  gc_heap_ptr_untyped gStack_48;
  ulong local_38;
  uint *local_30;
  
  if (regexp->type_ == object) {
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>
                      ((gc_heap_ptr_untyped *)&(regexp->field_1).s_);
    if (bVar1) {
      this_00 = (regexp->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                heap_;
      *(gc_heap **)this = this_00;
      *(undefined4 *)(this + 8) = *(undefined4 *)((long)&regexp->field_1 + 8);
      uVar4 = extraout_RDX;
      if (this_00 != (gc_heap *)0x0) {
        gc_heap::attach(this_00,(gc_heap_ptr_untyped *)this);
        uVar4 = extraout_RDX_00;
      }
      if (bVar1) goto LAB_0015e0c4;
    }
  }
  pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  to_string((mjs *)&gStack_48,*(gc_heap **)((long)pvVar2 + 8),regexp);
  puVar3 = (uint *)gc_heap_ptr_untyped::get(&gStack_48);
  local_30 = puVar3 + 1;
  local_38 = (ulong)*puVar3;
  regexp_object::make((gc_heap_ptr<mjs::global_object> *)this,(wstring_view *)global,
                      (regexp_flag)&local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_48);
  uVar4 = extraout_RDX_01;
LAB_0015e0c4:
  gVar5.super_gc_heap_ptr_untyped._8_8_ = uVar4;
  gVar5.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar5.super_gc_heap_ptr_untyped;
}

Assistant:

gc_heap_ptr<regexp_object> to_regexp_object(const gc_heap_ptr<global_object>& global, const value& regexp) {
    if (regexp.type() == value_type::object) {
        const auto& o = regexp.object_value();
        if (o.has_type<regexp_object>()) {
            return gc_heap_ptr<regexp_object>{o};
        }
    }
    auto& h = global->heap();
    return regexp_object::make(global, to_string(h, regexp).view(), regexp_flag::none);
}